

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O3

bool __thiscall GenCADFile::parse_file(GenCADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *string;
  int iVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  mpc_parser_t *pmVar9;
  mpc_parser_t *pmVar10;
  mpc_parser_t *pmVar11;
  mpc_parser_t *pmVar12;
  mpc_parser_t *pmVar13;
  mpc_parser_t *pmVar14;
  mpc_parser_t *pmVar15;
  mpc_parser_t *pmVar16;
  mpc_parser_t *pmVar17;
  mpc_parser_t *pmVar18;
  mpc_parser_t *pmVar19;
  mpc_parser_t *pmVar20;
  mpc_parser_t *pmVar21;
  mpc_parser_t *pmVar22;
  mpc_parser_t *pmVar23;
  mpc_parser_t *pmVar24;
  mpc_parser_t *pmVar25;
  mpc_parser_t *pmVar26;
  mpc_parser_t *pmVar27;
  mpc_parser_t *pmVar28;
  mpc_parser_t *pmVar29;
  mpc_parser_t *pmVar30;
  mpc_parser_t *pmVar31;
  mpc_parser_t *pmVar32;
  mpc_parser_t *pmVar33;
  mpc_parser_t *pmVar34;
  mpc_parser_t *pmVar35;
  mpc_parser_t *pmVar36;
  mpc_parser_t *pmVar37;
  mpc_parser_t *pmVar38;
  mpc_parser_t *pmVar39;
  mpc_parser_t *pmVar40;
  mpc_parser_t *pmVar41;
  mpc_parser_t *pmVar42;
  mpc_parser_t *pmVar43;
  mpc_parser_t *pmVar44;
  mpc_parser_t *pmVar45;
  mpc_parser_t *pmVar46;
  mpc_parser_t *pmVar47;
  mpc_parser_t *pmVar48;
  mpc_parser_t *pmVar49;
  mpc_parser_t *pmVar50;
  mpc_parser_t *pmVar51;
  mpc_parser_t *pmVar52;
  mpc_parser_t *pmVar53;
  mpc_parser_t *pmVar54;
  mpc_parser_t *pmVar55;
  mpc_parser_t *pmVar56;
  mpc_parser_t *pmVar57;
  mpc_parser_t *pmVar58;
  mpc_parser_t *pmVar59;
  mpc_parser_t *pmVar60;
  mpc_parser_t *pmVar61;
  mpc_parser_t *pmVar62;
  mpc_parser_t *pmVar63;
  mpc_parser_t *pmVar64;
  mpc_parser_t *pmVar65;
  mpc_parser_t *pmVar66;
  mpc_parser_t *pmVar67;
  mpc_parser_t *pmVar68;
  mpc_parser_t *pmVar69;
  mpc_parser_t *pmVar70;
  mpc_parser_t *p;
  mpc_err_t *x;
  mpc_ast_t *pmVar71;
  mpc_ast_t *pmVar72;
  long *plVar73;
  string *psVar74;
  mpc_result_t r;
  string parser_error;
  
  pmVar4 = mpc_new("s");
  pmVar5 = mpc_new("n");
  pmVar6 = mpc_new("sign");
  pmVar7 = mpc_new("number");
  pmVar8 = mpc_new("p_integer");
  pmVar9 = mpc_new("string");
  pmVar10 = mpc_new("nonquoted_string");
  pmVar11 = mpc_new("string_to_end");
  pmVar12 = mpc_new("wrapper_to_end");
  pmVar13 = mpc_new("arc_start");
  pmVar14 = mpc_new("arc_end");
  pmVar15 = mpc_new("arc_center");
  pmVar16 = mpc_new("arc_p1");
  pmVar17 = mpc_new("arc_p2");
  pmVar18 = mpc_new("arc_ref");
  pmVar19 = mpc_new("artwork_name");
  pmVar20 = mpc_new("attribute_category");
  pmVar21 = mpc_new("attribute_name");
  pmVar22 = mpc_new("attribute_data");
  pmVar23 = mpc_new("radius");
  pmVar24 = mpc_new("circle_ref");
  pmVar25 = mpc_new("component_name");
  pmVar26 = mpc_new("dimension");
  pmVar27 = mpc_new("drill_size");
  pmVar28 = mpc_new("fid_name");
  pmVar29 = mpc_new("filename");
  pmVar30 = mpc_new("filled_ref");
  pmVar31 = mpc_new("flip");
  pmVar32 = mpc_new("height");
  pmVar33 = mpc_new("width");
  pmVar34 = mpc_new("layer_index");
  pmVar35 = mpc_new("layer");
  pmVar36 = mpc_new("line_start");
  pmVar37 = mpc_new("line_end");
  pmVar38 = mpc_new("line_ref");
  pmVar39 = mpc_new("mirror");
  pmVar40 = mpc_new("pad_name");
  pmVar41 = mpc_new("pad_type");
  pmVar42 = mpc_new("part_name");
  pmVar43 = mpc_new("part_name_to_end");
  pmVar44 = mpc_new("pin_name");
  pmVar45 = mpc_new("probe");
  pmVar46 = mpc_new("rectangle_ref");
  pmVar47 = mpc_new("rot");
  pmVar48 = mpc_new("shape_name");
  pmVar49 = mpc_new("sig_name");
  pmVar50 = mpc_new("sig_name_to_end");
  pmVar51 = mpc_new("tan");
  pmVar52 = mpc_new("testpad_name");
  pmVar53 = mpc_new("text_size");
  pmVar54 = mpc_new("text_text");
  pmVar55 = mpc_new("text_par");
  pmVar56 = mpc_new("tp_name");
  pmVar57 = mpc_new("track_name");
  pmVar58 = mpc_new("track_width");
  pmVar59 = mpc_new("via_name");
  pmVar60 = mpc_new("x");
  pmVar61 = mpc_new("y");
  pmVar62 = mpc_new("x_y_ref");
  pmVar63 = mpc_new("header");
  pmVar64 = mpc_new("major");
  pmVar65 = mpc_new("minor");
  pmVar66 = mpc_new("version");
  pmVar67 = mpc_new("gencad_version");
  pmVar68 = mpc_new("user");
  pmVar69 = mpc_new("drawing");
  pmVar70 = mpc_new("revision");
  mpc_new("unit");
  mpc_new("units");
  mpc_new("origin");
  mpc_new("intertrack");
  mpc_new("attribute");
  mpc_new("name");
  mpc_new("thickness");
  mpc_new("line");
  mpc_new("arc");
  mpc_new("circle");
  mpc_new("rectangle");
  mpc_new("cutout");
  mpc_new("mask");
  mpc_new("artwork");
  mpc_new("board");
  mpc_new("pad");
  mpc_new("pads");
  mpc_new("padstacks_pad");
  mpc_new("padstack");
  mpc_new("padstacks");
  mpc_new("layer_name");
  mpc_new("named_layer");
  mpc_new("filled");
  mpc_new("text");
  mpc_new("artworks_artwork");
  mpc_new("artworks");
  mpc_new("fiducial");
  mpc_new("insert");
  mpc_new("height_");
  mpc_new("shape_artwork");
  mpc_new("fid");
  mpc_new("shape_pin_name");
  mpc_new("shapes_pin");
  mpc_new("shape");
  mpc_new("shapes");
  mpc_new("device_name");
  mpc_new("device_");
  mpc_new("place");
  mpc_new("rotation");
  mpc_new("shape_");
  mpc_new("artwork_");
  mpc_new("sheet");
  mpc_new("component");
  mpc_new("components");
  mpc_new("part");
  mpc_new("partemp");
  mpc_new("type");
  mpc_new("style");
  mpc_new("package");
  mpc_new("pindesc");
  mpc_new("pinfunct");
  mpc_new("pincount");
  mpc_new("tol");
  mpc_new("ptol");
  mpc_new("ntol");
  mpc_new("volts");
  mpc_new("desc");
  mpc_new("value");
  mpc_new("partnumber");
  mpc_new("device");
  mpc_new("devices");
  mpc_new("node");
  mpc_new("nailloc");
  mpc_new("signal");
  mpc_new("signals");
  mpc_new("track");
  mpc_new("tracks");
  mpc_new("define");
  mpc_new("layerset");
  mpc_new("layer_");
  mpc_new("layers");
  mpc_new("track_");
  mpc_new("route");
  mpc_new("nailloc_");
  mpc_new("via");
  mpc_new("testpad");
  mpc_new("plane");
  mpc_new("routes");
  mpc_new("hole");
  mpc_new("fhole");
  mpc_new("mechanical");
  mpc_new("mech");
  mpc_new("testpin");
  mpc_new("testpins");
  mpc_new("powerpin");
  mpc_new("powerpins");
  mpc_new("pseudo_signal");
  mpc_new("pseudo_device");
  mpc_new("pseudo_part");
  mpc_new("pseudo_shape");
  mpc_new("pseudo_component");
  mpc_new("pseudo_testpad");
  mpc_new("pseudo_padstack");
  mpc_new("pseudo_pin");
  mpc_new("pseudo_testpin");
  mpc_new("pseudo_powerpin");
  mpc_new("pseudo_via");
  mpc_new("pseudos");
  mpc_new("sig_change");
  mpc_new("dev_change");
  mpc_new("change");
  mpc_new("changes");
  p = mpc_new("gencad_file");
  x = mpca_lang(2,kGenCadFileBnf,pmVar4,pmVar5,pmVar6,pmVar7,pmVar8,pmVar9,pmVar10,pmVar11,pmVar12,
                pmVar13,pmVar14,pmVar15,pmVar16,pmVar17,pmVar18,pmVar19,pmVar20,pmVar21,pmVar22,
                pmVar23,pmVar24,pmVar25,pmVar26,pmVar27,pmVar28,pmVar29,pmVar30,pmVar31,pmVar32,
                pmVar33,pmVar34,pmVar35,pmVar36,pmVar37,pmVar38,pmVar39,pmVar40,pmVar41,pmVar42,
                pmVar43,pmVar44,pmVar45,pmVar46,pmVar47,pmVar48,pmVar49,pmVar50,pmVar51,pmVar52,
                pmVar53,pmVar54,pmVar55,pmVar56,pmVar57,pmVar58,pmVar59,pmVar60,pmVar61,pmVar62,
                pmVar63,pmVar64,pmVar65,pmVar66,pmVar67,pmVar68,pmVar69);
  if (x != (mpc_err_t *)0x0) {
    paVar2 = &parser_error.field_2;
    parser_error._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parser_error,"Failed to parse GenCAD file, parser reported:\n","");
    mpc_err_string(x);
    std::__cxx11::string::append((char *)&parser_error);
    mpc_err_delete(x);
    plVar73 = (long *)__cxa_allocate_exception(0x20);
    *plVar73 = (long)(plVar73 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)parser_error._M_dataplus._M_p == paVar2) {
      *(undefined4 *)(plVar73 + 2) = parser_error.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar73 + 0x14) = parser_error.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar73 + 3) = parser_error.field_2._8_4_;
      *(undefined4 *)((long)plVar73 + 0x1c) = parser_error.field_2._12_4_;
    }
    else {
      *plVar73 = (long)parser_error._M_dataplus._M_p;
      plVar73[2] = parser_error.field_2._M_allocated_capacity;
    }
    plVar73[1] = parser_error._M_string_length;
    parser_error._M_string_length = 0;
    parser_error.field_2._M_allocated_capacity =
         parser_error.field_2._M_allocated_capacity & 0xffffffffffffff00;
    parser_error._M_dataplus._M_p = (pointer)paVar2;
    __cxa_throw(plVar73,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  string = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = mpc_nparse("",string,
                     (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)string,p,&r);
  if (iVar3 == 0) {
    paVar2 = &parser_error.field_2;
    parser_error._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parser_error,"Failed to parse GenCAD file, parser reported:\n","");
    mpc_err_string(r.error);
    std::__cxx11::string::append((char *)&parser_error);
    mpc_err_delete(r.error);
    plVar73 = (long *)__cxa_allocate_exception(0x20);
    *plVar73 = (long)(plVar73 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)parser_error._M_dataplus._M_p == paVar2) {
      *(undefined4 *)(plVar73 + 2) = parser_error.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar73 + 0x14) = parser_error.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar73 + 3) = parser_error.field_2._8_4_;
      *(undefined4 *)((long)plVar73 + 0x1c) = parser_error.field_2._12_4_;
    }
    else {
      *plVar73 = (long)parser_error._M_dataplus._M_p;
      plVar73[2] = parser_error.field_2._M_allocated_capacity;
    }
    plVar73[1] = parser_error._M_string_length;
    parser_error._M_string_length = 0;
    parser_error.field_2._M_allocated_capacity =
         parser_error.field_2._M_allocated_capacity & 0xffffffffffffff00;
    parser_error._M_dataplus._M_p = (pointer)paVar2;
    __cxa_throw(plVar73,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (r.error == (mpc_err_t *)0x0) {
    psVar74 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar74 = psVar74 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar74,
               "Failed to parse GenCAD file: the file does not match the GenCAD format specification"
               ,"");
    __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pmVar71 = mpc_ast_get_child((mpc_ast_t *)r.error,"header|>");
  this->header_ast = pmVar71;
  if (pmVar71 != (mpc_ast_t *)0x0) {
    pmVar71 = mpc_ast_get_child((mpc_ast_t *)r.error,"board|>");
    pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"pads|>");
    this->pads_ast = pmVar72;
    if (pmVar72 == (mpc_ast_t *)0x0) {
      SDL_LogWarn(0,"Failed to parse GenCAD file: the $PADS section was not parsed properly");
    }
    pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"padstacks|>");
    this->padstacks_ast = pmVar72;
    if (pmVar72 == (mpc_ast_t *)0x0) {
      SDL_LogWarn(0,"Failed to parse GenCAD file: the $PADSTACKS section was not parsed properly");
    }
    pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"shapes|>");
    this->shapes_ast = pmVar72;
    if (pmVar72 == (mpc_ast_t *)0x0) {
      psVar74 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar74 = psVar74 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar74,"Failed to parse GenCAD file: the $SHAPES section was not parsed properly",
                 "");
      __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"components|>");
    this->components_ast = pmVar72;
    if (pmVar72 == (mpc_ast_t *)0x0) {
      psVar74 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar74 = psVar74 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar74,
                 "Failed to parse GenCAD file: the $COMPONENTS section was not parsed properly","");
      __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"devices|>");
    this->devices_ast = pmVar72;
    if (pmVar72 != (mpc_ast_t *)0x0) {
      pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"signals|>");
      this->signals_ast = pmVar72;
      if (pmVar72 != (mpc_ast_t *)0x0) {
        pmVar72 = mpc_ast_get_child((mpc_ast_t *)r.error,"routes|>");
        parse_dimension_units(this,this->header_ast);
        if (pmVar71 != (mpc_ast_t *)0x0) {
          parse_board_outline(this,pmVar71);
        }
        parse_components(this);
        if (pmVar72 != (mpc_ast_t *)0x0) {
          parse_vias(this,pmVar72);
        }
        puVar1 = (undefined1 *)((long)&parser_error.field_2 + 8);
        iVar3 = 2;
        do {
          parser_error.field_2._M_allocated_capacity = 0;
          parser_error.field_2._8_4_ = parser_error.field_2._8_4_ & 0xffffff00;
          parser_error._M_dataplus._M_p = "...";
          parser_error._M_string_length = (size_type)puVar1;
          std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                    (&(this->super_BRDFileBase).parts,(value_type *)&parser_error);
          if ((undefined1 *)parser_error._M_string_length != puVar1) {
            operator_delete((void *)parser_error._M_string_length,
                            CONCAT44(parser_error.field_2._12_4_,parser_error.field_2._8_4_) + 1);
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        BRDFileBase::AddNailsAsPins(&this->super_BRDFileBase);
        mpc_cleanup(0xaa,pmVar4,pmVar5,pmVar6,pmVar7,pmVar8,pmVar9,pmVar10,pmVar11,pmVar12,pmVar13,
                    pmVar14,pmVar15,pmVar16,pmVar17,pmVar18,pmVar19,pmVar20,pmVar21,pmVar22,pmVar23,
                    pmVar24,pmVar25,pmVar26,pmVar27,pmVar28,pmVar29,pmVar30,pmVar31,pmVar32,pmVar33,
                    pmVar34,pmVar35,pmVar36,pmVar37,pmVar38,pmVar39,pmVar40,pmVar41,pmVar42,pmVar43,
                    pmVar44,pmVar45,pmVar46,pmVar47,pmVar48,pmVar49,pmVar50,pmVar51,pmVar52,pmVar53,
                    pmVar54,pmVar55,pmVar56,pmVar57,pmVar58,pmVar59,pmVar60,pmVar61,pmVar62,pmVar63,
                    pmVar64,pmVar65,pmVar66,pmVar67,pmVar68,pmVar69,pmVar70);
        return true;
      }
      psVar74 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar74 = psVar74 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar74,"Failed to parse GenCAD file: the $SIGNALS section was not parsed properly"
                 ,"");
      __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    psVar74 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar74 = psVar74 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar74,"Failed to parse GenCAD file: the $DEVICES section was not parsed properly",
               "");
    __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  psVar74 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar74 = psVar74 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar74,"Failed to parse GenCAD file: the $HEADER section was not parsed properly","");
  __cxa_throw(psVar74,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool GenCADFile::parse_file(const std::vector<char> &buf) {
	bool ret = false;
#define X(CVAR, NAME) mpc_parser_t *CVAR = mpc_new((NAME));
	X_MACRO_PARSE_VARS
#undef X

#define X(CVAR, NAME) CVAR,
	mpc_err_t *language_error = mpca_lang(MPCA_LANG_WHITESPACE_SENSITIVE, kGenCadFileBnf, X_MACRO_PARSE_VARS NULL);
#undef X
	try {
		if (language_error != nullptr) {
			std::string parser_error("Failed to parse GenCAD file, parser reported:\n");
			parser_error.append(mpc_err_string(language_error));
			mpc_err_delete(language_error);
			throw parser_error;
		}

		mpc_result_t r;
		mpc_ast_t *ast = nullptr;
		ret            = true;
		if (mpc_nparse("", buf.data(), buf.size(), gencad_file, &r)) {
			ast = static_cast<mpc_ast_t *>(r.output);
			if (!ast) throw std::string("Failed to parse GenCAD file: the file does not match the GenCAD format specification");

			header_ast = mpc_ast_get_child(ast, "header|>");
			if (!header_ast) throw std::string("Failed to parse GenCAD file: the $HEADER section was not parsed properly");

			//sections marked as optinal are not found in some files, for example generated by "XY html to CAD V1.2" utility
			mpc_ast_t *optional_board_ast = mpc_ast_get_child(ast, "board|>");

			pads_ast = mpc_ast_get_child(ast, "pads|>");
			if (!pads_ast) {
				SDL_LogWarn(SDL_LOG_CATEGORY_APPLICATION, "Failed to parse GenCAD file: the $PADS section was not parsed properly");
			}

			padstacks_ast = mpc_ast_get_child(ast, "padstacks|>");
			if (!padstacks_ast) {
				SDL_LogWarn(SDL_LOG_CATEGORY_APPLICATION, "Failed to parse GenCAD file: the $PADSTACKS section was not parsed properly");
			}

			shapes_ast = mpc_ast_get_child(ast, "shapes|>");
			if (!shapes_ast) throw std::string("Failed to parse GenCAD file: the $SHAPES section was not parsed properly");

			components_ast = mpc_ast_get_child(ast, "components|>");
			if (!components_ast) throw std::string("Failed to parse GenCAD file: the $COMPONENTS section was not parsed properly");

			devices_ast = mpc_ast_get_child(ast, "devices|>");
			if (!devices_ast) throw std::string("Failed to parse GenCAD file: the $DEVICES section was not parsed properly");

			signals_ast = mpc_ast_get_child(ast, "signals|>");
			if (!signals_ast) throw std::string("Failed to parse GenCAD file: the $SIGNALS section was not parsed properly");

			//mpc_ast_t *optional_tracks_ast = mpc_ast_get_child(ast, "tracks|>");

			// $LAYERS section is optional and doesn't have to exist in a GenCAD file
			//mpc_ast_t * optional_layers_ast = mpc_ast_get_child(ast, "layers|>");

			mpc_ast_t *optional_routes_ast = mpc_ast_get_child(ast, "routes|>");

			parse_dimension_units(header_ast);
			if (optional_board_ast) {
				parse_board_outline(optional_board_ast);
			}
			parse_components();
			if (optional_routes_ast)
			{
				parse_vias(optional_routes_ast);
			}

			for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
				BRDPart part;
				part.name = "...";
				part.mounting_side =
				    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
				part.end_of_pins = 0;                                                  // Unused
				parts.push_back(part);
			}

			AddNailsAsPins();

		} else {
			std::string parser_error("Failed to parse GenCAD file, parser reported:\n");
			parser_error.append(mpc_err_string(r.error));
			mpc_err_delete(r.error);
			throw parser_error;
		}
	} catch (std::string &error) {
		ret       = false;
		error_msg = error;
		error_msg.append(
		    "\nIf you think your GenCAD file is correct please report an issue here:\n"
		    "https://github.com/OpenBoardView/OpenBoardView/issues\n");
	}

#define X(CVAR, NAME) CVAR,
	mpc_cleanup(PARSE_VARS_COUNT, X_MACRO_PARSE_VARS NULL);
#undef X
	return ret;
}